

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalUngroupedAggregate::Sink
          (PhysicalUngroupedAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  LocalSinkState *pLVar1;
  
  pLVar1 = input->local_state;
  DataChunk::Reset((DataChunk *)
                   &pLVar1[4].partition_info.partition_data.
                    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                    .
                    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  if ((this->distinct_data).
      super_unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateData_*,_std::default_delete<duckdb::DistinctAggregateData>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateData_*,_false>._M_head_impl !=
      (DistinctAggregateData *)0x0) {
    SinkDistinct(this,context,chunk,input);
  }
  UngroupedAggregateExecuteState::Sink
            ((UngroupedAggregateExecuteState *)(pLVar1 + 3),
             (LocalUngroupedAggregateState *)(pLVar1 + 1),chunk);
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalUngroupedAggregate::Sink(ExecutionContext &context, DataChunk &chunk,
                                                OperatorSinkInput &input) const {
	auto &sink = input.local_state.Cast<UngroupedAggregateLocalSinkState>();

	// perform the aggregation inside the local state
	sink.execute_state.Reset();

	if (distinct_data) {
		SinkDistinct(context, chunk, input);
	}

	sink.execute_state.Sink(sink.state, chunk);
	return SinkResultType::NEED_MORE_INPUT;
}